

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

void opj_j2k_dump_tile_info(opj_tcp_t *l_default_tile,OPJ_INT32 numcomps,FILE *out_stream)

{
  opj_tccp_t *poVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  long local_58;
  long local_50;
  
  if (l_default_tile != (opj_tcp_t *)0x0) {
    fwrite("\t default tile {\n",0x11,1,(FILE *)out_stream);
    fprintf((FILE *)out_stream,"\t\t csty=%#x\n",(ulong)l_default_tile->csty);
    fprintf((FILE *)out_stream,"\t\t prg=%#x\n",(ulong)(uint)l_default_tile->prg);
    fprintf((FILE *)out_stream,"\t\t numlayers=%d\n",(ulong)l_default_tile->numlayers);
    fprintf((FILE *)out_stream,"\t\t mct=%x\n",(ulong)l_default_tile->mct);
    if (0 < numcomps) {
      local_50 = 0x3b0;
      local_58 = 0x20;
      uVar3 = 0;
      do {
        poVar1 = l_default_tile->tccps;
        fprintf((FILE *)out_stream,"\t\t comp %d {\n");
        fprintf((FILE *)out_stream,"\t\t\t csty=%#x\n",(ulong)poVar1[uVar3].csty);
        fprintf((FILE *)out_stream,"\t\t\t numresolutions=%d\n",(ulong)poVar1[uVar3].numresolutions)
        ;
        fprintf((FILE *)out_stream,"\t\t\t cblkw=2^%d\n",(ulong)poVar1[uVar3].cblkw);
        fprintf((FILE *)out_stream,"\t\t\t cblkh=2^%d\n",(ulong)poVar1[uVar3].cblkh);
        fprintf((FILE *)out_stream,"\t\t\t cblksty=%#x\n",(ulong)poVar1[uVar3].cblksty);
        fprintf((FILE *)out_stream,"\t\t\t qmfbid=%d\n",(ulong)poVar1[uVar3].qmfbid);
        fwrite("\t\t\t preccintsize (w,h)=",0x17,1,(FILE *)out_stream);
        if (poVar1[uVar3].numresolutions != 0) {
          uVar4 = 0;
          do {
            fprintf((FILE *)out_stream,"(%d,%d) ",
                    (ulong)*(uint *)((long)poVar1 + uVar4 * 4 + local_50 + -0x84),
                    (ulong)*(uint *)((long)poVar1->stepsizes + uVar4 * 4 + local_50 + -0x1c));
            uVar4 = uVar4 + 1;
          } while (uVar4 < poVar1[uVar3].numresolutions);
        }
        fputc(10,(FILE *)out_stream);
        fprintf((FILE *)out_stream,"\t\t\t qntsty=%d\n",(ulong)poVar1[uVar3].qntsty);
        fprintf((FILE *)out_stream,"\t\t\t numgbits=%d\n",(ulong)poVar1[uVar3].numgbits);
        fwrite("\t\t\t stepsizes (m,e)=",0x14,1,(FILE *)out_stream);
        uVar2 = 1;
        if (poVar1[uVar3].qntsty != 1) {
          uVar2 = poVar1[uVar3].numresolutions * 3 - 2;
        }
        if (0 < (int)uVar2) {
          uVar4 = 0;
          do {
            fprintf((FILE *)out_stream,"(%d,%d) ",
                    (ulong)*(uint *)((long)poVar1->stepsizes + uVar4 * 8 + local_58 + -0x1c),
                    (ulong)*(uint *)((long)&poVar1->stepsizes[uVar4 - 4].expn + local_58));
            uVar4 = uVar4 + 1;
          } while (uVar2 != uVar4);
        }
        fputc(10,(FILE *)out_stream);
        fprintf((FILE *)out_stream,"\t\t\t roishift=%d\n",(ulong)(uint)poVar1[uVar3].roishift);
        fwrite("\t\t }\n",5,1,(FILE *)out_stream);
        uVar3 = uVar3 + 1;
        local_50 = local_50 + 0x438;
        local_58 = local_58 + 0x438;
      } while (uVar3 != (uint)numcomps);
    }
    fwrite("\t }\n",4,1,(FILE *)out_stream);
    return;
  }
  return;
}

Assistant:

static void opj_j2k_dump_tile_info( opj_tcp_t * l_default_tile,OPJ_INT32 numcomps,FILE* out_stream)
{
        if (l_default_tile)
        {
                OPJ_INT32 compno;

                fprintf(out_stream, "\t default tile {\n");
                fprintf(out_stream, "\t\t csty=%#x\n", l_default_tile->csty);
                fprintf(out_stream, "\t\t prg=%#x\n", l_default_tile->prg);
                fprintf(out_stream, "\t\t numlayers=%d\n", l_default_tile->numlayers);
                fprintf(out_stream, "\t\t mct=%x\n", l_default_tile->mct);

                for (compno = 0; compno < numcomps; compno++) {
                        opj_tccp_t *l_tccp = &(l_default_tile->tccps[compno]);
                        OPJ_UINT32 resno;
      OPJ_INT32 bandno, numbands;

                        /* coding style*/
                        fprintf(out_stream, "\t\t comp %d {\n", compno);
                        fprintf(out_stream, "\t\t\t csty=%#x\n", l_tccp->csty);
                        fprintf(out_stream, "\t\t\t numresolutions=%d\n", l_tccp->numresolutions);
                        fprintf(out_stream, "\t\t\t cblkw=2^%d\n", l_tccp->cblkw);
                        fprintf(out_stream, "\t\t\t cblkh=2^%d\n", l_tccp->cblkh);
                        fprintf(out_stream, "\t\t\t cblksty=%#x\n", l_tccp->cblksty);
                        fprintf(out_stream, "\t\t\t qmfbid=%d\n", l_tccp->qmfbid);

                        fprintf(out_stream, "\t\t\t preccintsize (w,h)=");
                        for (resno = 0; resno < l_tccp->numresolutions; resno++) {
                                fprintf(out_stream, "(%d,%d) ", l_tccp->prcw[resno], l_tccp->prch[resno]);
                        }
                        fprintf(out_stream, "\n");

                        /* quantization style*/
                        fprintf(out_stream, "\t\t\t qntsty=%d\n", l_tccp->qntsty);
                        fprintf(out_stream, "\t\t\t numgbits=%d\n", l_tccp->numgbits);
                        fprintf(out_stream, "\t\t\t stepsizes (m,e)=");
                        numbands = (l_tccp->qntsty == J2K_CCP_QNTSTY_SIQNT) ? 1 : (OPJ_INT32)l_tccp->numresolutions * 3 - 2;
                        for (bandno = 0; bandno < numbands; bandno++) {
                                fprintf(out_stream, "(%d,%d) ", l_tccp->stepsizes[bandno].mant,
                                        l_tccp->stepsizes[bandno].expn);
                        }
                        fprintf(out_stream, "\n");

                        /* RGN value*/
                        fprintf(out_stream, "\t\t\t roishift=%d\n", l_tccp->roishift);

                        fprintf(out_stream, "\t\t }\n");
                } /*end of component of default tile*/
                fprintf(out_stream, "\t }\n"); /*end of default tile*/
            }
}